

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O1

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(int *colVals,int *rowPtr,int *consP,int base)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int k_1;
  int iVar12;
  long lVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int k;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  undefined4 uVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  Real c_R [9];
  Real dcRdT [9];
  undefined1 local_5c8 [16];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined8 local_588;
  double adStack_580 [21];
  double local_4d8;
  double local_4d0;
  double local_4c8 [5];
  undefined1 auStack_4a0 [16];
  undefined1 auStack_490 [16];
  double local_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  double dStack_458;
  double local_450;
  double local_448;
  double local_440 [2];
  double adStack_430 [90];
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined1 local_128 [16];
  double local_118 [10];
  double local_c8 [10];
  double local_78 [9];
  
  memset(&local_478,0,800);
  adStack_580[7] = 0.0;
  adStack_580[8] = 0.0;
  adStack_580[5] = 0.0;
  adStack_580[6] = 0.0;
  adStack_580[3] = 0.0;
  adStack_580[4] = 0.0;
  adStack_580[1] = 0.0;
  adStack_580[2] = 0.0;
  adStack_580[9] = 0.0;
  lVar13 = 1;
  auVar34 = _DAT_006979b0;
  do {
    if (SUB164(auVar34 ^ _DAT_006979c0,4) == -0x80000000 &&
        SUB164(auVar34 ^ _DAT_006979c0,0) < -0x7ffffff7) {
      adStack_580[lVar13] = 0.1111111111111111;
      adStack_580[lVar13 + 1] = 0.1111111111111111;
    }
    lVar16 = auVar34._8_8_;
    auVar34._0_8_ = auVar34._0_8_ + 2;
    auVar34._8_8_ = lVar16 + 2;
    lVar13 = lVar13 + 2;
  } while (lVar13 != 0xb);
  iVar12 = *consP;
  pdVar14 = &local_478;
  lVar13 = 0;
  memset(pdVar14,0,800);
  local_598 = (undefined1  [16])0x0;
  local_5a8 = (undefined1  [16])0x0;
  local_5b8 = (undefined1  [16])0x0;
  local_5c8 = (undefined1  [16])0x0;
  local_588 = 0;
  local_480 = 0.0;
  do {
    local_480 = local_480 + adStack_580[lVar13 + 1];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 9);
  adStack_580[0xb] = 2.911342024497792;
  adStack_580[0xc] = 3.254512984911126;
  adStack_580[0xd] = -15.528347679998124;
  adStack_580[0xe] = 19.481084666666668;
  adStack_580[0xf] = 22.009669090999374;
  adStack_580[0x10] = 5.94295186894925;
  adStack_580[0x11] = 5.3818731557687505;
  adStack_580[0x12] = -5.101694818407498;
  adStack_580[0x13] = 3.0794232161958335;
  local_130 = adStack_580[2] * adStack_580[4];
  dVar19 = (((adStack_580[3] * 10.0 +
             adStack_580[2] * -0.21999999999999997 + adStack_580[1] + local_480) * 1e-12) /
           118698922.25997423) * 1838773899538452.5;
  local_4d0 = dVar19 / (dVar19 + 1.0);
  local_4d8 = -0.0006207345732258481 / (dVar19 + 1.0);
  adStack_580[0x14] = log10(dVar19);
  local_138 = exp(-1.5e+33);
  local_138 = local_138 * 0.19999999999999996;
  local_140 = local_138 + 0.8;
  local_158 = log10(local_140);
  local_128._0_8_ = local_158 * -1.27 + 0.75;
  local_128._8_8_ = extraout_XMM0_Qb;
  local_148 = local_158 * -0.67 + -0.4 + adStack_580[0x14];
  adStack_580[0x14] = 1.0 / (local_148 * -0.14 + (double)local_128._0_8_);
  local_148 = local_148 * adStack_580[0x14];
  local_150 = 1.0 / (local_148 * local_148 + 1.0);
  dVar20 = pow(10.0,local_158 * local_150);
  dVar46 = local_138 / -1e-30;
  dVar35 = 0.43429448190325176 / local_140;
  dVar19 = (local_158 + local_158) * local_150 * local_150 * local_148 * adStack_580[0x14];
  dVar65 = -(double)local_128._0_8_ * dVar19 * adStack_580[0x14];
  dVar19 = dVar19 * local_148;
  dVar36 = dVar65 * -0.67 + local_150;
  dVar20 = dVar20 * local_4d0;
  dVar52 = (local_130 * 118698922.25997423 + adStack_580[7] * -11503468.582662737) * dVar20;
  local_5c8._8_8_ = (double)local_5c8._8_8_ - dVar52;
  local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar52;
  local_598._0_8_ = dVar52 + (double)local_598._0_8_;
  lVar13 = 0;
  local_4c8[0] = 0.0;
  local_4c8[1] = adStack_580[4] * dVar20 * 118698922.25997423 + 0.0;
  local_4c8[2] = 0.0;
  local_4c8[3] = dVar20 * 118698922.25997423 * adStack_580[2] + 0.0;
  local_4c8[4] = 0.0;
  auStack_4a0._0_8_ = 0;
  auStack_4a0._8_8_ = dVar20 * -11503468.582662737 + 0.0;
  auStack_490 = ZEXT816(0);
  pdVar15 = &dStack_470;
  do {
    dVar1 = local_4c8[lVar13];
    *pdVar15 = *pdVar15 - dVar1;
    pdVar15[2] = pdVar15[2] - dVar1;
    pdVar15[5] = dVar1 + pdVar15[5];
    lVar13 = lVar13 + 1;
    pdVar15 = pdVar15 + 10;
  } while (lVar13 != 9);
  dVar19 = dVar20 * (local_130 * 47479.56890398969 +
                    (((adStack_580[0x11] - (adStack_580[0xc] + adStack_580[0xe])) + 1.0) *
                     -0.0006666666666666666 + 0.00039999999999999996) * -11503468.582662737 *
                    adStack_580[7]) +
           (dVar65 * -0.0006207345732258481 + (dVar19 * -1.27 + dVar36) * (dVar46 + -8e-31) * dVar35
           + local_4d8) * 2.302585092994046 * dVar52;
  pdVar15 = local_440;
  adStack_430[0x52] = adStack_430[0x52] - dVar19;
  adStack_430[0x54] = adStack_430[0x54] - dVar19;
  adStack_430[0x57] = dVar19 + adStack_430[0x57];
  dVar19 = (((adStack_580[3] * 11.0 + adStack_580[1] * 1.5 + local_480) * 1e-06) / 25936106.98548031
           ) * 28231227327.532616;
  local_130 = adStack_580[8];
  local_4d0 = dVar19 / (dVar19 + 1.0);
  local_4d8 = -0.0002845931413337665 / (dVar19 + 1.0);
  adStack_580[0x14] = log10(dVar19);
  local_140 = exp(-1.5e+33);
  local_140 = local_140 * 0.5;
  local_138 = local_140 + 0.5;
  local_158 = log10(local_138);
  dVar19 = local_158 * -1.27 + 0.75;
  local_128._8_4_ = (int)extraout_XMM0_Qb_00;
  local_128._0_8_ = dVar19;
  local_128._12_4_ = (int)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  local_148 = local_158 * -0.67 + -0.4 + adStack_580[0x14];
  adStack_580[0x14] = 1.0 / (local_148 * -0.14 + dVar19);
  local_148 = local_148 * adStack_580[0x14];
  local_150 = 1.0 / (local_148 * local_148 + 1.0);
  dVar20 = pow(10.0,local_158 * local_150);
  uVar11 = local_5b8._0_8_;
  uVar10 = local_5c8._8_8_;
  dVar35 = (local_158 + local_158) * local_150 * local_150 * local_148 * adStack_580[0x14];
  adStack_580[0x14] = -(double)local_128._0_8_ * dVar35 * adStack_580[0x14];
  dVar20 = dVar20 * local_4d0;
  dVar36 = (local_130 * 25936106.98548031 + adStack_580[6] * adStack_580[6] * -3419315.29664768) *
           dVar20;
  dVar19 = dVar36 + dVar36 + (double)local_5a8._8_8_;
  local_5a8._8_8_ = dVar19;
  local_598._8_8_ = (double)local_598._8_8_ - dVar36;
  local_4c8[0] = 0.0;
  local_4c8[1] = 0.0;
  local_4c8[2] = 0.0;
  local_4c8[3] = 0.0;
  lVar13 = 0;
  local_4c8[4] = 0.0;
  auStack_4a0._8_8_ = 0;
  auStack_4a0._0_8_ = dVar20 * 3419315.29664768 * -2.0 * adStack_580[6] + 0.0;
  auStack_490._8_8_ = 0;
  auStack_490._0_8_ = dVar20 * 25936106.98548031 + 0.0;
  do {
    dVar46 = local_4c8[lVar13];
    pdVar15[-2] = dVar46 + dVar46 + pdVar15[-2];
    *pdVar15 = *pdVar15 - dVar46;
    lVar13 = lVar13 + 1;
    pdVar15 = pdVar15 + 10;
  } while (lVar13 != 9);
  dVar20 = dVar20 * (local_130 * 280925.8837546357 +
                    ((((adStack_580[0x10] + adStack_580[0x10]) - adStack_580[0x12]) + -1.0) *
                     -0.0006666666666666666 + 0.010831459166632262) * -3419315.29664768 *
                    adStack_580[6] * adStack_580[6]) +
           (adStack_580[0x14] * -0.0002845931413337665 +
            (dVar35 * local_148 * -1.27 + adStack_580[0x14] * -0.67 + local_150) *
            (local_140 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_138) +
           local_4d8) * 2.302585092994046 * dVar36;
  adStack_430[0x56] = dVar20 + dVar20 + adStack_430[0x56];
  adStack_430[0x58] = adStack_430[0x58] - dVar20;
  dVar20 = adStack_580[3] * 11.0 + adStack_580[1] * 1.5 + local_480;
  local_4c8[1] = adStack_580[1] * 1.0145869685785861e-06 +
                 adStack_580[4] * adStack_580[4] * -407.1662961015109;
  dVar35 = dVar20 * local_4c8[1];
  local_5c8._0_8_ = (double)local_5c8._0_8_ - dVar35;
  local_5b8._8_8_ = dVar35 + dVar35 + (double)local_5b8._8_8_;
  local_4c8[0] = local_4c8[1] * 2.5 + dVar20 * 1.0145869685785861e-06;
  local_4c8[2] = local_4c8[1] * 12.0;
  local_4c8[3] = dVar20 * 407.1662961015109 * -2.0 * adStack_580[4] + local_4c8[1];
  local_4c8[4] = local_4c8[1];
  auStack_490._8_8_ = local_4c8[1];
  auStack_490._0_8_ = local_4c8[1];
  auStack_4a0._8_8_ = local_4c8[1];
  auStack_4a0._0_8_ = local_4c8[1];
  lVar13 = 0;
  do {
    dVar35 = local_4c8[lVar13];
    *pdVar14 = *pdVar14 - dVar35;
    pdVar14[3] = dVar35 + dVar35 + pdVar14[3];
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar13 != 9);
  dVar20 = dVar20 * (adStack_580[1] * 2.2738361995042403e-08 +
                    ((((adStack_580[0xe] + adStack_580[0xe]) - adStack_580[0xb]) + -1.0) *
                     -0.0006666666666666666 + 0.022411446922976298) * -407.1662961015109 *
                    adStack_580[4] * adStack_580[4]);
  pdVar14 = &dStack_470;
  adStack_430[0x51] = adStack_430[0x51] - dVar20;
  adStack_430[0x54] = dVar20 + dVar20 + adStack_430[0x54];
  dVar20 = adStack_580[3] * 11.0 + adStack_580[1] * 1.5 + local_480;
  local_4c8[3] = adStack_580[5] * adStack_580[5] * 159.17961552912485 +
                 adStack_580[2] * -2.0846475553480232e-08;
  dVar35 = dVar20 * local_4c8[3];
  local_5c8._8_8_ = (double)uVar10 + dVar35;
  local_5a8._0_8_ = (double)local_5a8._0_8_ - (dVar35 + dVar35);
  local_4c8[0] = local_4c8[3] * 2.5;
  local_4c8[1] = dVar20 * -2.0846475553480232e-08 + local_4c8[3];
  local_4c8[2] = local_4c8[3] * 12.0;
  local_4c8[4] = (dVar20 * 159.17961552912485 + dVar20 * 159.17961552912485) * adStack_580[5] +
                 local_4c8[3];
  uVar51 = (undefined4)((ulong)local_4c8[3] >> 0x20);
  auStack_490._8_4_ = SUB84(local_4c8[3],0);
  auStack_490._0_8_ = local_4c8[3];
  auStack_490._12_4_ = uVar51;
  auStack_4a0._8_4_ = SUB84(local_4c8[3],0);
  auStack_4a0._0_8_ = local_4c8[3];
  auStack_4a0._12_4_ = uVar51;
  lVar13 = 0;
  do {
    dVar36 = local_4c8[lVar13];
    *pdVar14 = *pdVar14 + dVar36;
    pdVar14[3] = pdVar14[3] - (dVar36 + dVar36);
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar13 != 9);
  dVar20 = dVar20 * (adStack_580[5] * adStack_580[5] * -0.05305987184304161 +
                    (((adStack_580[0xc] - (adStack_580[0xf] + adStack_580[0xf])) + 1.0) *
                     -0.0006666666666666666 + -0.0003333333333333333) * -2.0846475553480232e-08 *
                    adStack_580[2]);
  pdVar14 = &local_450;
  adStack_430[0x52] = adStack_430[0x52] + dVar20;
  adStack_430[0x55] = adStack_430[0x55] - (dVar20 + dVar20);
  local_4c8[1] = adStack_580[5] * adStack_580[4] * 3142.6666666666665 +
                 adStack_580[6] * -5.646680545093694e-06;
  dVar20 = adStack_580[3] * 11.0 + adStack_580[1] * 1.5 + local_480;
  dVar36 = dVar20 * local_4c8[1];
  local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar36;
  local_5a8._0_8_ = (double)local_5a8._0_8_ - dVar36;
  local_5a8._8_8_ = dVar36 + dVar19;
  local_4c8[0] = local_4c8[1] * 2.5;
  local_4c8[2] = local_4c8[1] * 12.0;
  local_4c8[3] = dVar20 * 3142.6666666666665 * adStack_580[5] + local_4c8[1];
  local_4c8[4] = dVar20 * 3142.6666666666665 * adStack_580[4] + local_4c8[1];
  auStack_4a0._0_8_ = dVar20 * -5.646680545093694e-06 + local_4c8[1];
  auStack_4a0._8_8_ = local_4c8[1];
  auStack_490._0_8_ = local_4c8[1];
  auStack_490._8_8_ = local_4c8[1];
  lVar13 = 0;
  do {
    dVar46 = local_4c8[lVar13];
    pdVar14[-2] = pdVar14[-2] - dVar46;
    pdVar14[-1] = pdVar14[-1] - dVar46;
    *pdVar14 = dVar46 + *pdVar14;
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar13 != 9);
  dVar20 = (adStack_580[5] * adStack_580[4] * -2.095111111111111 +
           (((adStack_580[0x10] - (adStack_580[0xe] + adStack_580[0xf])) + 1.0) *
            -0.0006666666666666666 + -0.0006666666666666666) * -5.646680545093694e-06 *
           adStack_580[6]) * dVar20;
  pdVar14 = &local_468;
  adStack_430[0x54] = adStack_430[0x54] - dVar20;
  adStack_430[0x55] = adStack_430[0x55] - dVar20;
  adStack_430[0x56] = dVar20 + adStack_430[0x56];
  dVar46 = adStack_580[3] * 11.0 + adStack_580[1] * 1.5 + local_480;
  local_4c8[1] = adStack_580[4] * adStack_580[6] * 16888.888888888887 +
                 adStack_580[3] * -1.4321870058604512e-06;
  dVar20 = dVar46 * local_4c8[1];
  local_5b8._8_8_ = (double)local_5b8._8_8_ - dVar20;
  local_5b8._0_8_ = (double)uVar11 + dVar20;
  local_5a8._8_8_ = (dVar36 + dVar19) - dVar20;
  local_4c8[0] = local_4c8[1] * 2.5;
  local_4c8[2] = dVar46 * -1.4321870058604512e-06 + local_4c8[1] * 12.0;
  local_4c8[3] = local_4c8[1] + adStack_580[6] * dVar46 * 16888.888888888887;
  local_4c8[4] = local_4c8[1];
  auStack_4a0._8_8_ = local_4c8[1];
  auStack_4a0._0_8_ = dVar46 * 16888.888888888887 * adStack_580[4] + local_4c8[1];
  auStack_490._8_8_ = local_4c8[1];
  auStack_490._0_8_ = local_4c8[1];
  lVar13 = 0;
  do {
    dVar19 = local_4c8[lVar13];
    *pdVar14 = *pdVar14 + dVar19;
    pdVar14[1] = pdVar14[1] - dVar19;
    pdVar14[3] = pdVar14[3] - dVar19;
    lVar13 = lVar13 + 1;
    pdVar14 = pdVar14 + 10;
  } while (lVar13 != 9);
  dVar46 = dVar46 * (adStack_580[4] * adStack_580[6] * -22.518518518518515 +
                    (((adStack_580[0xd] - (adStack_580[0xe] + adStack_580[0x10])) + 1.0) *
                     -0.0006666666666666666 + -0.0013333333333333333) * -1.4321870058604512e-06 *
                    adStack_580[3]);
  dVar62 = adStack_580[4] * adStack_580[2] * 694956.7634748495 +
           adStack_580[6] * adStack_580[5] * -9534710.169227276;
  dVar37 = adStack_580[4] * adStack_580[2] * 2391.8538305613447 +
           (0.0034417304158633542 -
           ((adStack_580[0xf] + adStack_580[0x10]) - (adStack_580[0xc] + adStack_580[0xe])) *
           0.0006666666666666666) * -9534710.169227276 * adStack_580[6] * adStack_580[5];
  dVar47 = adStack_580[4] * 694956.7634748495;
  dVar21 = adStack_580[2] * 694956.7634748495;
  dVar22 = adStack_580[6] * -9534710.169227276;
  dVar53 = adStack_580[5] * -9534710.169227276;
  dVar38 = adStack_580[5] * adStack_580[1] * 1860366.9115799016 +
           adStack_580[4] * adStack_580[6] * -1341454.8115373214;
  dVar19 = adStack_580[5] * 1860366.9115799016;
  dStack_458 = dStack_458 - dVar19;
  dVar48 = adStack_580[5] * adStack_580[1] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((adStack_580[0xe] + adStack_580[0x10]) - (adStack_580[0xb] + adStack_580[0xf])) *
           0.0006666666666666666) * -1341454.8115373214 * adStack_580[4] * adStack_580[6];
  dVar36 = adStack_580[6] * -1341454.8115373214;
  adStack_430[0x19] = (dVar21 + adStack_430[0x19]) - dVar36;
  dVar23 = adStack_580[1] * 1860366.9115799016;
  adStack_430[0x1f] = adStack_430[0x1f] - dVar23;
  adStack_430[0x22] = (adStack_430[0x22] - dVar22) + dVar23;
  dVar60 = adStack_580[4] * -1341454.8115373214;
  dVar68 = adStack_580[6] * adStack_580[1] * 4271828.084344627 +
           adStack_580[4] * adStack_580[3] * -145376.75098299314;
  dVar24 = adStack_580[6] * 4271828.084344627;
  local_468 = dVar24 + local_468;
  local_450 = (dVar19 + local_450) - dVar24;
  dVar25 = adStack_580[4] * -145376.75098299314;
  adStack_430[0xb] = adStack_430[0xb] - dVar25;
  dVar66 = adStack_580[1] * 4271828.084344627;
  adStack_430[0x29] = (adStack_430[0x29] - dVar60) - dVar66;
  dVar39 = adStack_580[5] * adStack_580[3] * 86324.17110758815 +
           adStack_580[6] * adStack_580[6] * -1829063.0057653617;
  dVar45 = adStack_580[7] * adStack_580[4] * 12595057.621245861 +
           adStack_580[2] * adStack_580[1] * -0.32384379658070717;
  dVar54 = adStack_580[6] * adStack_580[1] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((adStack_580[0xd] + adStack_580[0xe]) - (adStack_580[0xb] + adStack_580[0x10])) *
           0.0006666666666666666) * -145376.75098299314 * adStack_580[4] * adStack_580[3];
  dVar75 = adStack_580[5] * adStack_580[3] * 374.95779706744673 +
           (0.00434360147634811 -
           ((adStack_580[0x10] + adStack_580[0x10]) - (adStack_580[0xd] + adStack_580[0xf])) *
           0.0006666666666666666) * -1829063.0057653617 * adStack_580[6] * adStack_580[6];
  dVar77 = adStack_580[7] * adStack_580[4] * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((adStack_580[0xb] + adStack_580[0xc]) - (adStack_580[0xe] + adStack_580[0x11])) *
           0.0006666666666666666) * -0.32384379658070717 * adStack_580[2] * adStack_580[1];
  dVar55 = adStack_580[5] * 86324.17110758815;
  adStack_430[0xf] = adStack_430[0xf] - dVar55;
  dVar26 = adStack_580[3] * 86324.17110758815;
  adStack_430[0x21] = adStack_430[0x21] - dVar26;
  dVar27 = adStack_580[6] * -3658126.0115307234;
  dVar74 = adStack_580[2] * -0.32384379658070717;
  dStack_470 = dVar74 + dStack_470;
  dVar28 = adStack_580[1] * -0.32384379658070717;
  adStack_430[1] = dVar28 + adStack_430[1];
  adStack_430[4] = (adStack_430[4] - dVar47) - dVar28;
  dVar69 = adStack_580[7] * 12595057.621245861;
  dVar71 = adStack_580[4] * 12595057.621245861;
  dVar52 = adStack_580[3] * -145376.75098299314;
  dVar65 = dVar52 + (adStack_430[0x18] - dVar21) + dVar36;
  auVar2._8_4_ = SUB84(dVar65,0);
  auVar2._0_8_ = dVar52 + adStack_430[0x17];
  auVar2._12_4_ = (int)((ulong)dVar65 >> 0x20);
  dVar65 = ((dVar37 + adStack_430[0x55]) - dVar48) - dVar75;
  dVar1 = (dVar48 + dVar37 + (adStack_430[0x56] - dVar46)) - dVar54;
  auVar3._8_4_ = SUB84(dVar1,0);
  auVar3._0_8_ = dVar65;
  auVar3._12_4_ = (int)((ulong)dVar1 >> 0x20);
  adStack_430[0x56] = auVar3._8_8_;
  dVar20 = (dVar68 + (double)uVar11 + dVar20) - dVar39;
  dVar1 = (dVar68 + ((double)local_5b8._8_8_ - dVar62) + dVar38) - dVar45;
  auVar4._8_4_ = SUB84(dVar1,0);
  auVar4._0_8_ = dVar20;
  auVar4._12_4_ = (int)((ulong)dVar1 >> 0x20);
  adStack_430[0x16] = dVar69 + (adStack_430[0x16] - dVar21);
  adStack_430[0x18] = auVar2._8_8_;
  dVar1 = (dVar54 + adStack_430[0x53] + dVar46) - dVar75;
  dVar46 = (dVar54 + ((adStack_430[0x54] - dVar46) - dVar37) + dVar48) - dVar77;
  auVar5._8_4_ = SUB84(dVar46,0);
  auVar5._0_8_ = dVar1;
  auVar5._12_4_ = (int)((ulong)dVar46 >> 0x20);
  dVar67 = adStack_580[7] * adStack_580[4] * 64119709.90701692 +
           adStack_580[6] * adStack_580[6] * -16.310006106092114;
  dVar56 = adStack_580[7] * adStack_580[4] * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((adStack_580[0x10] + adStack_580[0x10]) - (adStack_580[0xe] + adStack_580[0x11])) *
           0.0006666666666666666) * -16.310006106092114 * adStack_580[6] * adStack_580[6];
  local_5b8._8_8_ = auVar4._8_8_;
  dVar29 = adStack_580[7] * 64119709.90701692;
  dVar40 = adStack_580[6] * -32.62001221218423;
  dVar63 = adStack_580[4] * 64119709.90701692;
  adStack_430[0x54] = auVar5._8_8_;
  dVar41 = adStack_580[7] * adStack_580[5] * 32500000.0 +
           adStack_580[6] * adStack_580[2] * -0.6025543492746578;
  dVar46 = adStack_580[7] * adStack_580[5] * 0.0 +
           (0.0 - ((adStack_580[0xc] + adStack_580[0x10]) - (adStack_580[0xf] + adStack_580[0x11]))
                  * 0.0006666666666666666) * -0.6025543492746578 * adStack_580[6] * adStack_580[2];
  local_4d8 = dVar47 + adStack_430[5];
  local_4d0 = dVar47 + adStack_430[6];
  local_480 = adStack_430[7] - dVar28;
  dVar73 = adStack_580[7] * 32500000.0;
  adStack_430[0x20] = (adStack_430[0x20] - dVar22) + dVar73;
  dVar30 = adStack_580[2] * -0.6025543492746578;
  dVar70 = adStack_580[5] * 32500000.0;
  dVar31 = adStack_580[6] * 34143562.115192875;
  dVar8 = dVar71 + adStack_430[0x34] + dVar70 + dVar31;
  auVar6._8_4_ = SUB84(adStack_430[0x35] + dVar31,0);
  auVar6._0_8_ = dVar8;
  auVar6._12_4_ = (int)((ulong)(adStack_430[0x35] + dVar31) >> 0x20);
  dVar9 = (dVar63 + dVar63 + adStack_430[0x38] + dVar70) - dVar31;
  dVar31 = (((adStack_430[0x39] - dVar71) - dVar63) - dVar70) - dVar31;
  auVar7._8_4_ = SUB84(dVar31,0);
  auVar7._0_8_ = dVar9;
  auVar7._12_4_ = (int)((ulong)dVar31 >> 0x20);
  dVar76 = adStack_580[8] * -150.1634478502138;
  dVar32 = adStack_580[7] * 15085094.926858293;
  adStack_430[0x35] = auVar6._8_8_;
  adStack_430[0x39] = auVar7._8_8_;
  dVar42 = adStack_580[2] * -150.1634478502138;
  dVar57 = adStack_580[6] * -0.6025543492746578;
  adStack_430[5] = (dVar47 + adStack_430[5]) - dVar57;
  dVar43 = adStack_580[3] * -0.029876205886692417;
  adStack_430[3] = adStack_430[3] + dVar43;
  adStack_430[6] = (dVar47 + adStack_430[6] + dVar57) - dVar43;
  dVar44 = adStack_580[2] * -0.029876205886692417;
  adStack_430[0xc] = adStack_430[0xc] + dVar44;
  dVar72 = adStack_580[7] * 34143562.115192875;
  adStack_430[0x2a] = (adStack_430[0x2a] - dVar53) + dVar30 + dVar72;
  dVar49 = adStack_580[7] * adStack_580[7] * 20212.492175153773 +
           (0.0026797964842987356 -
           ((adStack_580[0xc] + adStack_580[0x12]) - (adStack_580[0x11] + adStack_580[0x11])) *
           0.0006666666666666666) * -150.1634478502138 * adStack_580[8] * adStack_580[2];
  dVar50 = adStack_580[6] * adStack_580[7] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((adStack_580[0xc] + adStack_580[0xd]) - (adStack_580[0x10] + adStack_580[0x11])) *
           0.0006666666666666666) * -0.029876205886692417 * adStack_580[2] * adStack_580[3];
  dVar58 = adStack_580[7] * adStack_580[7] * 7542547.463429146 +
           adStack_580[8] * adStack_580[2] * -150.1634478502138;
  dVar59 = adStack_580[6] * adStack_580[7] * 34143562.115192875 +
           adStack_580[2] * adStack_580[3] * -0.029876205886692417;
  dVar64 = adStack_580[7] * adStack_580[7] * 224556.7351007675 +
           adStack_580[8] * adStack_580[2] * -4.470666408692084;
  dVar31 = adStack_580[7] * adStack_580[7] * -81.82756742036453 +
           (-0.0003643959615980579 -
           ((adStack_580[0xc] + adStack_580[0x12]) - (adStack_580[0x11] + adStack_580[0x11])) *
           0.0006666666666666666) * -4.470666408692084 * adStack_580[8] * adStack_580[2];
  dVar33 = adStack_580[8] * -4.470666408692084;
  adStack_430[2] = dVar28 + (adStack_430[2] - dVar47) + dVar57 + dVar43 + dVar76 + dVar33;
  adStack_430[7] =
       ((((adStack_430[7] - dVar28) - dVar57) - dVar43) - (dVar76 + dVar76)) - (dVar33 + dVar33);
  adStack_430[8] = dVar33 + adStack_430[8] + dVar76;
  dVar33 = adStack_580[7] * 449113.470201535;
  adStack_580[2] = adStack_580[2] * -4.470666408692084;
  adStack_430[0x3e] = adStack_430[0x3e] + dVar42 + adStack_580[2];
  adStack_430[0x52] = (adStack_430[0x52] - dVar37) + dVar77 + dVar46 + dVar50 + dVar49 + dVar31;
  dVar61 = adStack_580[8] * adStack_580[4] * 6362141.693962547 +
           adStack_580[3] * adStack_580[6] * -7.112730406981104e-05;
  dVar76 = adStack_580[8] * adStack_580[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((adStack_580[0xd] + adStack_580[0x10]) - (adStack_580[0xe] + adStack_580[0x12])) *
           0.0006666666666666666) * -7.112730406981104e-05 * adStack_580[3] * adStack_580[6];
  dVar43 = adStack_580[6] * -7.112730406981104e-05;
  adStack_430[0xe] = (dVar25 + adStack_430[0xe]) - dVar43;
  dVar47 = adStack_580[8] * 6362141.693962547;
  adStack_430[0x1a] = dVar29 + dVar29 + ((dVar36 + dVar21 + adStack_430[0x1a]) - dVar52) + dVar47;
  dVar37 = adStack_580[3] * -7.112730406981104e-05;
  adStack_430[0x2c] = ((dVar66 + (adStack_430[0x2c] - dVar53) + dVar60) - dVar40) - dVar37;
  dVar21 = adStack_580[4] * 6362141.693962547;
  dVar28 = adStack_580[8] * adStack_580[4] * 3347824.3674030215 +
           adStack_580[1] * adStack_580[7] * -4323.663734083463;
  dVar57 = adStack_580[8] * adStack_580[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((adStack_580[0xb] + adStack_580[0x11]) - (adStack_580[0xe] + adStack_580[0x12])) *
           0.0006666666666666666) * -4323.663734083463 * adStack_580[1] * adStack_580[7];
  local_5c8._8_8_ =
       dVar45 + (((double)uVar10 + dVar35) - dVar62) + dVar41 + dVar59 + dVar58 + dVar64;
  local_5c8._0_8_ = dVar45 + (((double)local_5c8._0_8_ - dVar38) - dVar68) + dVar28;
  dVar35 = adStack_580[7] * -4323.663734083463;
  local_478 = dVar74 + ((local_478 - dVar19) - dVar24) + dVar35;
  dStack_460 = ((dVar24 + dStack_460 + dVar19) - dVar74) - dVar35;
  local_448 = (local_448 - dVar74) + dVar35;
  local_440[0] = local_440[0] - dVar35;
  dVar19 = adStack_580[8] * 3347824.3674030215;
  adStack_430[0x15] = dVar69 + ((adStack_430[0x15] - dVar36) - dVar52) + dVar19;
  adStack_430[0x18] = (((adStack_430[0x18] - dVar69) - dVar29) - dVar47) - dVar19;
  adStack_430[0x17] = dVar52 + adStack_430[0x17] + dVar47;
  adStack_430[0x1b] = ((adStack_430[0x1b] - dVar69) - dVar29) + dVar19;
  adStack_580[1] = adStack_580[1] * -4323.663734083463;
  adStack_430[0x1c] = (adStack_430[0x1c] - dVar47) - dVar19;
  adStack_430[0x33] = dVar71 + adStack_430[0x33] + adStack_580[1];
  adStack_430[0x36] = ((adStack_430[0x36] - dVar71) - dVar63) - adStack_580[1];
  adStack_580[4] = adStack_580[4] * 3347824.3674030215;
  adStack_430[0x3d] = adStack_430[0x3d] + adStack_580[4];
  adStack_430[0x40] = (adStack_430[0x40] - dVar21) - adStack_580[4];
  adStack_430[0x51] = ((adStack_430[0x51] - dVar48) - dVar54) + dVar77 + dVar57;
  dVar29 = adStack_580[8] * adStack_580[5] * 5672469.694980093 +
           adStack_580[7] * adStack_580[6] * -5282.492258864639;
  dVar19 = adStack_580[8] * adStack_580[5] * 12599.866574880663 +
           (0.0022212311836643283 -
           ((adStack_580[0x10] + adStack_580[0x11]) - (adStack_580[0xf] + adStack_580[0x12])) *
           0.0006666666666666666) * -5282.492258864639 * adStack_580[7] * adStack_580[6];
  dVar35 = adStack_580[8] * 5672469.694980093;
  adStack_430[0x23] = ((((dVar22 + adStack_430[0x23]) - dVar23) - dVar26) - dVar73) - dVar35;
  adStack_430[0x24] = dVar35 + dVar26 + dVar26 + dVar23 + dVar22 + adStack_430[0x24] + dVar73;
  adStack_430[0x25] = dVar35 + (adStack_430[0x25] - dVar73);
  adStack_430[0x26] = adStack_430[0x26] - dVar35;
  dVar26 = adStack_580[7] * -5282.492258864639;
  adStack_430[0x2d] = ((((dVar53 + adStack_430[0x2d]) - dVar60) - dVar27) - dVar30) - dVar26;
  dVar36 = adStack_580[6] * -5282.492258864639;
  adStack_430[0x37] = (adStack_430[0x37] - dVar70) - dVar36;
  adStack_580[5] = adStack_580[5] * 5672469.694980093;
  adStack_430[0x41] = adStack_430[0x41] - adStack_580[5];
  dVar47 = adStack_580[8] * adStack_580[6] * 1000000.0 +
           adStack_580[7] * adStack_580[3] * -43.95116952269832;
  dVar23 = adStack_580[8] * adStack_580[6] * 0.0 +
           (0.0 - ((adStack_580[0xd] + adStack_580[0x11]) - (adStack_580[0x10] + adStack_580[0x12]))
                  * 0.0006666666666666666) * -43.95116952269832 * adStack_580[7] * adStack_580[3];
  dVar52 = adStack_580[7] * -43.95116952269832;
  dVar48 = adStack_580[8] * 1000000.0;
  dVar35 = adStack_580[3] * -43.95116952269832;
  dVar24 = adStack_580[6] * 1000000.0;
  dVar54 = adStack_580[8] * adStack_580[6] * 23496864.50220335 +
           adStack_580[7] * adStack_580[3] * -1032.714674988212;
  dVar22 = adStack_580[8] * adStack_580[6] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((adStack_580[0xd] + adStack_580[0x11]) - (adStack_580[0x10] + adStack_580[0x12])) *
           0.0006666666666666666) * -1032.714674988212 * adStack_580[7] * adStack_580[3];
  local_5b8._8_8_ = (((double)local_5b8._8_8_ - dVar67) - dVar61) - dVar28;
  local_5b8._0_8_ = dVar20 + dVar59 + dVar61 + dVar47 + dVar54;
  local_5a8._8_8_ =
       ((dVar29 + ((dVar67 + dVar67 +
                    dVar39 + dVar39 + ((dVar38 + dVar62 + (double)local_5a8._8_8_) - dVar68) +
                   dVar41) - dVar59) + dVar61) - dVar47) - dVar54;
  local_5a8._0_8_ = ((((dVar62 + (double)local_5a8._0_8_) - dVar38) - dVar39) - dVar41) - dVar29;
  local_598._8_8_ =
       (((((dVar64 + dVar58 + (double)local_598._8_8_) - dVar61) - dVar28) - dVar29) - dVar47) -
       dVar54;
  local_598._0_8_ =
       dVar29 + (((((((double)local_598._0_8_ - dVar45) - dVar67) - dVar41) - dVar59) -
                 (dVar58 + dVar58)) - (dVar64 + dVar64)) + dVar28 + dVar47 + dVar54;
  adStack_580[7] = adStack_580[7] * -1032.714674988212;
  adStack_430[0xd] =
       ((dVar25 + adStack_430[0xd]) - dVar55) + dVar44 + dVar43 + dVar52 + adStack_580[7];
  adStack_430[0x10] =
       ((((dVar55 + dVar55 + (adStack_430[0x10] - dVar25)) - dVar44) + dVar43) - dVar52) -
       adStack_580[7];
  adStack_430[0x11] = (adStack_430[0x11] - dVar44) + dVar52 + adStack_580[7];
  adStack_430[0x12] = ((adStack_430[0x12] - dVar43) - dVar52) - adStack_580[7];
  adStack_580[8] = adStack_580[8] * 23496864.50220335;
  adStack_430[0x2b] =
       ((dVar66 + adStack_430[0x2b]) - dVar27) + dVar72 + dVar37 + dVar48 + adStack_580[8];
  adStack_430[0x2e] =
       ((dVar26 + ((dVar40 + dVar40 +
                    dVar27 + dVar27 + ((dVar60 + dVar53 + adStack_430[0x2e]) - dVar66) + dVar30) -
                  dVar72) + dVar37) - dVar48) - adStack_580[8];
  adStack_430[0x2f] =
       dVar26 + (((adStack_430[0x2f] - dVar40) - dVar30) - dVar72) + dVar48 + adStack_580[8];
  adStack_580[3] = adStack_580[3] * -1032.714674988212;
  adStack_430[0x30] = (((adStack_430[0x30] - dVar37) - dVar26) - dVar48) - adStack_580[8];
  adStack_430[0x35] = adStack_430[0x35] + dVar35 + adStack_580[3];
  adStack_430[0x34] = dVar8 + dVar32 + dVar33;
  adStack_430[0x39] =
       dVar36 + ((adStack_430[0x39] - (dVar32 + dVar32)) - (dVar33 + dVar33)) + adStack_580[1] +
       dVar35 + adStack_580[3];
  adStack_430[0x38] = ((dVar36 + dVar9) - dVar35) - adStack_580[3];
  adStack_430[0x3a] =
       ((((dVar33 + dVar32 + adStack_430[0x3a]) - adStack_580[1]) - dVar36) - dVar35) -
       adStack_580[3];
  adStack_580[6] = adStack_580[6] * 23496864.50220335;
  adStack_430[0x3f] = adStack_430[0x3f] + dVar21 + dVar24 + adStack_580[6];
  adStack_430[0x42] = ((adStack_580[5] + adStack_430[0x42] + dVar21) - dVar24) - adStack_580[6];
  adStack_430[0x43] =
       adStack_580[5] +
       ((adStack_430[0x43] - (dVar42 + dVar42)) - (adStack_580[2] + adStack_580[2])) +
       adStack_580[4] + dVar24 + adStack_580[6];
  adStack_430[0x44] =
       (((((adStack_580[2] + dVar42 + adStack_430[0x44]) - dVar21) - adStack_580[4]) -
        adStack_580[5]) - dVar24) - adStack_580[6];
  adStack_430[0x54] = ((adStack_430[0x54] - dVar56) - dVar76) - dVar57;
  adStack_430[0x53] = dVar1 + dVar50 + dVar76 + dVar23 + dVar22;
  adStack_430[0x56] =
       ((dVar19 + ((dVar56 + dVar56 + dVar75 + dVar75 + adStack_430[0x56] + dVar46) - dVar50) +
                  dVar76) - dVar23) - dVar22;
  adStack_430[0x55] = (dVar65 - dVar46) - dVar19;
  adStack_430[0x57] =
       dVar19 + ((((((adStack_430[0x57] - dVar77) - dVar56) - dVar46) - dVar50) - (dVar49 + dVar49))
                - (dVar31 + dVar31)) + dVar57 + dVar23 + dVar22;
  adStack_430[0x58] =
       (((((dVar31 + adStack_430[0x58] + dVar49) - dVar76) - dVar57) - dVar19) - dVar23) - dVar22;
  if (iVar12 == 0) {
    local_118[0] = 2.8916149455543745;
    local_118[1] = 3.3887808219431252;
    local_118[2] = 4.665255136408125;
    local_118[3] = 1.5;
    local_118[4] = 1.506900950283125;
    local_118[5] = 2.9628176357525002;
    local_118[6] = 5.2821630604062495;
    local_118[7] = 7.4795990834;
    local_118[8] = 3.1861205355625004;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar14 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_118[0] = 3.8916149455543745;
    local_118[1] = 4.388780821943126;
    local_118[2] = 5.665255136408124;
    local_118[3] = 2.5;
    local_118[4] = 2.506900950283125;
    local_118[5] = 3.9628176357525002;
    local_118[6] = 6.28216306040625;
    local_118[7] = 8.4795990834;
    local_118[8] = 4.1861205355625;
    local_c8[0] = 0.00049010354654;
    local_c8[1] = 0.000340356715215;
    local_c8[2] = 0.0011616005819375;
    local_c8[3] = 0.0;
    local_c8[4] = -1.20361935e-05;
    local_c8[5] = 0.00046729736768999996;
    local_c8[6] = 0.0009643321552500001;
    local_c8[7] = 0.0013043066091500003;
    local_c8[8] = 0.00037292866150000014;
    pdVar14 = adStack_580 + 0xb;
  }
  dVar36 = 0.0;
  dVar20 = 0.0;
  dVar35 = 0.0;
  lVar13 = 0;
  dVar19 = 0.0;
  do {
    dVar46 = *(double *)((long)adStack_580 + lVar13 + 8);
    dVar19 = dVar19 + *(double *)((long)local_118 + lVar13) * dVar46;
    dVar52 = *(double *)((long)pdVar14 + lVar13);
    dVar36 = dVar36 + dVar46 * *(double *)((long)local_c8 + lVar13);
    dVar20 = dVar20 + *(double *)(local_5c8 + lVar13) * dVar52;
    dVar35 = dVar35 + (*(double *)((long)local_118 + lVar13) - dVar52) * 0.0006666666666666666 *
                      *(double *)(local_5c8 + lVar13) +
                      dVar52 * *(double *)((long)adStack_430 + lVar13 + 0x288);
    lVar13 = lVar13 + 8;
  } while (lVar13 != 0x48);
  dVar20 = dVar20 * (1.0 / dVar19);
  dVar46 = (1.0 / dVar19) * 1500.0;
  dVar19 = dVar20 * dVar46;
  pdVar15 = &local_478;
  lVar13 = 0;
  do {
    dVar52 = 0.0;
    lVar16 = 0;
    do {
      dVar52 = dVar52 + pdVar14[lVar16] * pdVar15[lVar16];
      lVar16 = lVar16 + 1;
    } while (lVar16 != 9);
    adStack_430[lVar13 * 10] = local_118[lVar13] * dVar19 + dVar52 * -dVar46;
    lVar13 = lVar13 + 1;
    pdVar15 = pdVar15 + 10;
  } while (lVar13 != 9);
  local_160 = (dVar19 * dVar36 - dVar20) - dVar46 * dVar35;
  if (base == 1) {
    *rowPtr = 1;
    iVar12 = 1;
    pdVar14 = &local_478;
    lVar13 = 0;
    lVar16 = 0;
    do {
      lVar16 = lVar16 + 1;
      lVar17 = 0;
      iVar18 = 1;
      do {
        if (lVar13 == lVar17) {
          colVals[(long)iVar12 + -1] = (int)lVar16;
LAB_0013f887:
          iVar12 = iVar12 + 1;
        }
        else if ((*(double *)((long)pdVar14 + lVar17) != 0.0) ||
                (NAN(*(double *)((long)pdVar14 + lVar17)))) {
          colVals[(long)iVar12 + -1] = iVar18;
          goto LAB_0013f887;
        }
        iVar18 = iVar18 + 1;
        lVar17 = lVar17 + 0x50;
      } while (lVar17 != 800);
      rowPtr[lVar16] = iVar12;
      lVar13 = lVar13 + 0x50;
      pdVar14 = pdVar14 + 1;
    } while (lVar16 != 10);
  }
  else {
    *rowPtr = 0;
    lVar13 = 0;
    pdVar14 = &local_478;
    iVar12 = 0;
    do {
      lVar16 = 0;
      pdVar15 = pdVar14;
      do {
        lVar17 = lVar13;
        if (((lVar13 == lVar16) || (lVar17 = lVar16, *pdVar15 != 0.0)) || (NAN(*pdVar15))) {
          colVals[iVar12] = (int)lVar17;
          iVar12 = iVar12 + 1;
        }
        lVar16 = lVar16 + 1;
        pdVar15 = pdVar15 + 10;
      } while (lVar16 != 10);
      rowPtr[lVar13 + 1] = iVar12;
      lVar13 = lVar13 + 1;
      pdVar14 = pdVar14 + 1;
    } while (lVar13 != 10);
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
  int* colVals, int* rowPtr, const int* consP, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp - 1] = l + 1;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp - 1] = k + 1;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int l = 0; l < 10; l++) {
      for (int k = 0; k < 10; k++) {
        if (k == l) {
          colVals[nJdata_tmp] = l;
          nJdata_tmp = nJdata_tmp + 1;
        } else {
          if (Jac[10 * k + l] != 0.0) {
            colVals[nJdata_tmp] = k;
            nJdata_tmp = nJdata_tmp + 1;
          }
        }
      }
      rowPtr[l + 1] = nJdata_tmp;
    }
  }
}